

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpoolheap.h
# Opt level: O0

void __thiscall
Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>::ThreadPoolHeap
          (ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap> *this)

{
  ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap> *in_RDI;
  Array<128UL,_Hoard::PerThreadHoardHeap> *unaff_retaddr;
  int i;
  int j;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int local_1c;
  
  PerThreadHoardHeap::PerThreadHoardHeap((PerThreadHoardHeap *)0x11abf8);
  Array<128UL,_Hoard::PerThreadHoardHeap>::Array(unaff_retaddr);
  for (local_1c = 0; local_1c < 0x800; local_1c = local_1c + 1) {
    setTidMap(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

ThreadPoolHeap()
    {
      static_assert((NumHeaps & NumHeapsMask) == 0,
		    "Number of heaps must be a power of two.");
      static_assert((NumThreads & NumThreadsMask) == 0,
		    "Number of threads must be a power of two.");
    
      // Note: The tidmap values should be set externally.
      int j = 0;
      for (int i = 0; i < NumThreads; i++) {
	setTidMap(i, j % NumHeaps);
	j++;
      }
    }